

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O2

void mzd_addmul_v_uint64_129(mzd_local_t *c,mzd_local_t *v,mzd_local_t *A)

{
  block_t *fblock;
  long lVar1;
  int iVar2;
  word wVar3;
  block_t *pbVar4;
  bool bVar5;
  
  mzd_xor_mask_uint64_block(c,A + 0x3f,(long)v->w64[0] >> 0x3f,3);
  iVar2 = 2;
  fblock = A + 0x40;
  while (pbVar4 = fblock, bVar5 = iVar2 != 0, iVar2 = iVar2 + -1, bVar5) {
    v = (mzd_local_t *)((long)v + 8);
    wVar3 = *(word *)v;
    for (lVar1 = 0; fblock = (block_t *)((long)pbVar4->w64 + lVar1), (int)lVar1 != 0x800;
        lVar1 = lVar1 + 0x20) {
      mzd_xor_mask_uint64_block(c,fblock,-(ulong)((uint)wVar3 & 1),3);
      wVar3 = wVar3 >> 1;
    }
  }
  return;
}

Assistant:

void mzd_addmul_v_uint64_129(mzd_local_t* c, mzd_local_t const* v, mzd_local_t const* A) {
  block_t* cblock       = BLOCK(c, 0);
  const word* vptr      = CONST_BLOCK(v, 0)->w64;
  const block_t* Ablock = CONST_BLOCK(A, 0);

  Ablock += 63;
  {
    word idx        = (*vptr) >> 63;
    const word mask = -(idx & 1);
    mzd_xor_mask_uint64_block(cblock, Ablock, mask, 3);
    Ablock++;
    vptr++;
  }

  for (unsigned int w = 2; w; --w, ++vptr) {
    word idx = *vptr;
    for (unsigned int i = sizeof(word) * 8; i; --i, idx >>= 1, ++Ablock) {
      const word mask = -(idx & 1);
      mzd_xor_mask_uint64_block(cblock, Ablock, mask, 3);
    }
  }
}